

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderStructValue
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  Field *pFVar3;
  CodedInputStream *input;
  uint32 first_byte_or_zero;
  
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    first_byte_or_zero = (uint32)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar1->buffer_ = pbVar2 + 1;
      input = (CodedInputStream *)__return_storage_ptr__;
      goto LAB_00317654;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  input = pCVar1;
  first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
LAB_00317654:
  pCVar1->last_tag_ = first_byte_or_zero;
  if (first_byte_or_zero != 0) {
    do {
      pFVar3 = FindAndVerifyField((ProtoStreamObjectSource *)input,(Type *)os,first_byte_or_zero);
      if (pFVar3 == (Field *)0x0) {
        input = this->stream_;
        protobuf::internal::WireFormat::SkipField(input,first_byte_or_zero,(UnknownFieldSet *)0x0);
      }
      else {
        (*(this->super_ObjectSource)._vptr_ObjectSource[6])
                  (__return_storage_ptr__,this,pFVar3,type,field_name.ptr_,field_name.length_);
        if (__return_storage_ptr__->error_code_ != OK) {
          return __return_storage_ptr__;
        }
        input = (CodedInputStream *)(__return_storage_ptr__->error_message_)._M_dataplus._M_p;
        if (input != (CodedInputStream *)&(__return_storage_ptr__->error_message_).field_2) {
          operator_delete(input);
        }
      }
      pCVar1 = this->stream_;
      pbVar2 = pCVar1->buffer_;
      if (pbVar2 < pCVar1->buffer_end_) {
        first_byte_or_zero = (uint32)*pbVar2;
        if ((char)*pbVar2 < '\0') goto LAB_003176de;
        pCVar1->buffer_ = pbVar2 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_003176de:
        input = pCVar1;
        first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
      }
      pCVar1->last_tag_ = first_byte_or_zero;
    } while (first_byte_or_zero != 0);
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderStructValue(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  const google::protobuf::Field* field = nullptr;
  for (uint32 tag = os->stream_->ReadTag(); tag != 0;
       tag = os->stream_->ReadTag()) {
    field = os->FindAndVerifyField(type, tag);
    if (field == nullptr) {
      WireFormat::SkipField(os->stream_, tag, nullptr);
      continue;
    }
    RETURN_IF_ERROR(os->RenderField(field, field_name, ow));
  }
  return util::Status();
}